

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax(Scope *scope,ClassMethodPrototypeSyntax *syntax)

{
  TokenKind TVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  bool bVar2;
  int iVar3;
  Compilation *this;
  FunctionPrototypeSyntax *pFVar4;
  type *this_00;
  SourceLocation arguments_00;
  SourceLocation this_01;
  DataTypeSyntax *newType;
  DeclaredType *pDVar5;
  Type *newType_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *__s;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  string_view sVar6;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  ClassType *classType;
  MethodPrototypeSymbol *result;
  Token nameToken;
  SubroutineKind subroutineKind;
  type *visibility;
  type *flags;
  FunctionPrototypeSyntax *proto;
  Compilation *comp;
  type *r;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffe60;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe68;
  Token *in_stack_fffffffffffffe70;
  Scope *in_stack_fffffffffffffe88;
  Symbol *in_stack_fffffffffffffe90;
  SourceLocation *in_stack_fffffffffffffe98;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea0;
  Compilation *args;
  Compilation *this_02;
  FunctionPrototypeSyntax *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  byte bVar7;
  undefined8 local_120;
  undefined8 local_118;
  bitmask<slang::ast::MethodFlags> local_fa;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_f8 [2];
  bitmask<slang::ast::MethodFlags> local_b2;
  SourceRange local_b0;
  undefined4 local_9c;
  ClassType *local_98;
  bitmask<slang::ast::MethodFlags> local_8c;
  bitmask<slang::ast::MethodFlags> local_8a [9];
  undefined1 auVar8 [12];
  SourceLocation in_stack_ffffffffffffffa8;
  TokenKind local_50;
  
  this = Scope::getCompilation(in_RDI);
  pFVar4 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
                     ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x4a5bf0);
  getMethodFlags((TokenList *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
  this_00 = std::get<0ul,slang::bitmask<slang::ast::MethodFlags>,slang::ast::Visibility>
                      ((pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> *)
                       0x4a5c26);
  std::get<1ul,slang::bitmask<slang::ast::MethodFlags>,slang::ast::Visibility>
            ((pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> *)0x4a5c3b);
  TVar1 = (pFVar4->keyword).kind;
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x4a5c76);
  _local_50 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffe90);
  if (local_50 == NewKeyword) {
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffae,Constructor);
    bitmask<slang::ast::MethodFlags>::operator|=
              (this_00,(bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffae);
  }
  args = this;
  this_02 = this;
  sVar6 = parsing::Token::valueText(in_stack_fffffffffffffe70);
  auVar8 = sVar6._4_12_;
  arguments_00 = parsing::Token::location((Token *)&local_50);
  r = this_00;
  this_01 = (SourceLocation)
            BumpAllocator::
            emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility&,slang::bitmask<slang::ast::MethodFlags>&>
                      (&this_02->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       in_stack_fffffffffffffea0._M_extent_value,in_stack_fffffffffffffe98,
                       &in_stack_fffffffffffffe90->kind,(Visibility *)in_stack_fffffffffffffe88,
                       (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffec0);
  Symbol::setSyntax((Symbol *)this_01,in_RSI);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffea0._M_extent_value;
  syntax_00._M_ptr = (pointer)in_stack_fffffffffffffe98;
  Symbol::setAttributes(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,syntax_00);
  bVar7 = 0;
  if (TVar1 != TaskKeyword) {
    bitmask<slang::ast::MethodFlags>::bitmask(local_8a,Constructor);
    bVar2 = bitmask<slang::ast::MethodFlags>::has(in_stack_fffffffffffffe60,r);
    bVar7 = bVar2 ^ 0xff;
  }
  if ((bVar7 & 1) == 0) {
    pDVar5 = (DeclaredType *)((long)this_01 + 0x78);
    newType_00 = Compilation::getVoidType(this);
    DeclaredType::setType(pDVar5,newType_00);
  }
  else {
    pDVar5 = (DeclaredType *)((long)this_01 + 0x78);
    newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                        ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4a5e2a);
    DeclaredType::setTypeSyntax(pDVar5,newType);
  }
  bitmask<slang::ast::MethodFlags>::bitmask(&local_8c,Pure);
  bVar2 = bitmask<slang::ast::MethodFlags>::has(in_stack_fffffffffffffe60,r);
  if (bVar2) {
    Scope::asSymbol(in_RDI);
    local_98 = Symbol::as<slang::ast::ClassType>((Symbol *)0x4a5eb3);
    if (((local_98->isAbstract & 1U) == 0) && ((local_98->isInterface & 1U) == 0)) {
      local_9c = 0xb30006;
      local_b0 = parsing::Token::range((Token *)in_RDI);
      sourceRange.endLoc = in_stack_ffffffffffffffa8;
      sourceRange.startLoc = this_01;
      Scope::addDiag(auVar8._4_8_,local_50._4_4_,sourceRange);
      local_b2 = ast::operator~(None);
      bitmask<slang::ast::MethodFlags>::operator&=(this_00,&local_b2);
    }
  }
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x4a5f6f);
  src = extraout_RDX;
  if (pFVar4->portList != (FunctionPortListSyntax *)0x0) {
    local_fa = SubroutineSymbol::buildArguments
                         ((Scope *)in_stack_ffffffffffffffa8,(Scope *)this_01,auVar8._4_8_,
                          auVar8._0_4_,
                          (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)arguments_00)
    ;
    bitmask<slang::ast::MethodFlags>::operator|=
              ((bitmask<slang::ast::MethodFlags> *)((long)this_01 + 0xc0),&local_fa);
    src = extraout_RDX_00;
  }
  iVar3 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                    (local_f8,(EVP_PKEY_CTX *)this,src);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar3),__s);
  *(undefined8 *)((long)this_01 + 200) = local_120;
  *(undefined8 *)((long)this_01 + 0xd0) = local_118;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x4a6099);
  return (MethodPrototypeSymbol *)this_01;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const Scope& scope,
                                                         const ClassMethodPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto [flags, visibility] = getMethodFlags(syntax.qualifiers, proto);
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    Token nameToken = proto.name->getLastToken();
    if (nameToken.kind == TokenKind::NewKeyword)
        flags |= MethodFlags::Constructor;

    auto result = comp.emplace<MethodPrototypeSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location(), subroutineKind,
                                                      visibility, flags);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    if (subroutineKind == SubroutineKind::Function && !flags.has(MethodFlags::Constructor))
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    // Pure virtual methods can only appear in virtual or interface classes.
    if (flags.has(MethodFlags::Pure)) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (!classType.isAbstract && !classType.isInterface) {
            scope.addDiag(diag::PureInAbstract, nameToken.range());
            flags &= ~MethodFlags::Pure;
        }
    }

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, scope, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    result->arguments = arguments.copy(comp);
    return *result;
}